

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength)

{
  UChar *s;
  char16_t *pcVar1;
  UBool UVar2;
  ushort uVar3;
  int iVar4;
  char16_t *pcVar5;
  int32_t iVar6;
  int newCapacity;
  char16_t *pcVar7;
  bool bVar8;
  UnicodeString copy;
  UnicodeString local_70;
  
  if (((srcChars != (UChar *)0x0) && (srcLength != 0)) &&
     (uVar3 = (this->fUnion).fStackFields.fLengthAndFlags, (uVar3 & 0x11) == 0)) {
    s = srcChars + srcStart;
    if (srcLength < 0) {
      srcLength = u_strlen_63(s);
      if (srcLength == 0) {
        return this;
      }
      uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
    }
    if ((short)uVar3 < 0) {
      iVar6 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar3 >> 5;
    }
    pcVar7 = (this->fUnion).fStackFields.fBuffer;
    pcVar1 = (this->fUnion).fFields.fArray;
    pcVar5 = pcVar7;
    if ((uVar3 & 2) == 0) {
      pcVar5 = pcVar1;
    }
    if ((uVar3 & 0x19) == 0) {
      bVar8 = true;
      if ((uVar3 & 4) != 0) {
        bVar8 = *(int *)(pcVar1 + -2) == 1;
      }
      if (((bVar8) && (pcVar5 < s + srcLength)) && (s < pcVar5 + iVar6)) {
        UnicodeString(&local_70,s,srcLength);
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
          }
          this = doAppend(this,local_70.fUnion.fFields.fArray,0,srcLength);
        }
        else {
          setToBogus(this);
        }
        ~UnicodeString(&local_70);
        return this;
      }
    }
    newCapacity = iVar6 + srcLength;
    uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
    iVar4 = 0x1b;
    if ((uVar3 & 2) == 0) {
      iVar4 = (this->fUnion).fFields.fCapacity;
    }
    if (((iVar4 < newCapacity) || ((uVar3 & 0x19) != 0)) ||
       (((uVar3 & 4) != 0 && (*(int *)((this->fUnion).fFields.fArray + -2) != 1)))) {
      iVar4 = (newCapacity >> 2) + 0x80 + newCapacity;
      if (0x7ffffff5 - newCapacity < (newCapacity >> 2) + 0x80) {
        iVar4 = 0x7ffffff5;
      }
      UVar2 = cloneArrayIfNeeded(this,newCapacity,iVar4,'\x01',(int32_t **)0x0,'\0');
      if (UVar2 == '\0') {
        return this;
      }
    }
    uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar3 & 2) == 0) {
      pcVar7 = (this->fUnion).fFields.fArray;
    }
    if ((0 < srcLength) && (s != pcVar7 + iVar6)) {
      memmove(pcVar7 + iVar6,s,(ulong)(uint)(srcLength * 2));
      uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
    }
    if (newCapacity < 0x400) {
      (this->fUnion).fStackFields.fLengthAndFlags = (short)newCapacity * 0x20 | uVar3 & 0x1f;
    }
    else {
      (this->fUnion).fStackFields.fLengthAndFlags = uVar3 | 0xffe0;
      (this->fUnion).fFields.fLength = newCapacity;
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UChar *srcChars, int32_t srcStart, int32_t srcLength) {
  if(!isWritable() || srcLength == 0 || srcChars == NULL) {
    return *this;
  }

  // Perform all remaining operations relative to srcChars + srcStart.
  // From this point forward, do not use srcStart.
  srcChars += srcStart;

  if(srcLength < 0) {
    // get the srcLength if necessary
    if((srcLength = u_strlen(srcChars)) == 0) {
      return *this;
    }
  }

  int32_t oldLength = length();
  int32_t newLength = oldLength + srcLength;

  // Check for append onto ourself
  const UChar* oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doAppend(copy.getArrayStart(), 0, srcLength);
  }

  // optimize append() onto a large-enough, owned string
  if((newLength <= getCapacity() && isBufferWritable()) ||
      cloneArrayIfNeeded(newLength, getGrowCapacity(newLength))) {
    UChar *newArray = getArrayStart();
    // Do not copy characters when
    //   UChar *buffer=str.getAppendBuffer(...);
    // is followed by
    //   str.append(buffer, length);
    // or
    //   str.appendString(buffer, length)
    // or similar.
    if(srcChars != newArray + oldLength) {
      us_arrayCopy(srcChars, 0, newArray, oldLength, srcLength);
    }
    setLength(newLength);
  }
  return *this;
}